

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O2

void Assimp::Write(JSONWriter *out,aiAnimation *ai,bool is_elem)

{
  uint n;
  ulong uVar1;
  allocator<char> local_41;
  string local_40;
  
  JSONWriter::StartObj(out,is_elem);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"name",&local_41);
  JSONWriter::Key(out,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  JSONWriter::SimpleValue<aiString>(out,&ai->mName);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"tickspersecond",&local_41)
  ;
  JSONWriter::Key(out,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  JSONWriter::SimpleValue<double>(out,&ai->mTicksPerSecond);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"duration",&local_41);
  JSONWriter::Key(out,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  JSONWriter::SimpleValue<double>(out,&ai->mDuration);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"channels",&local_41);
  JSONWriter::Key(out,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  JSONWriter::StartArray(out,false);
  for (uVar1 = 0; uVar1 < ai->mNumChannels; uVar1 = uVar1 + 1) {
    Write(out,ai->mChannels[uVar1],true);
  }
  JSONWriter::EndArray(out);
  JSONWriter::EndObj(out);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiAnimation& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("name");
    out.SimpleValue(ai.mName);

    out.Key("tickspersecond");
    out.SimpleValue(ai.mTicksPerSecond);

    out.Key("duration");
    out.SimpleValue(ai.mDuration);

    out.Key("channels");
    out.StartArray();
    for (unsigned int n = 0; n < ai.mNumChannels; ++n) {
        Write(out, *ai.mChannels[n]);
    }
    out.EndArray();
    out.EndObj();
}